

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colorspace.cpp
# Opt level: O0

RGBColorSpace * pbrt::RGBColorSpace::Lookup(Point2f r,Point2f g,Point2f b,Point2f w)

{
  bool bVar1;
  anon_class_1_0_00000001 *this;
  anon_class_1_0_00000001 *a;
  undefined1 in_XMM0 [16];
  undefined1 in_XMM1 [16];
  undefined1 in_XMM2 [16];
  undefined1 in_XMM3 [16];
  RGBColorSpace *cs;
  const_iterator __end1;
  const_iterator __begin1;
  initializer_list<const_pbrt::RGBColorSpace_*> *__range1;
  anon_class_1_0_00000001 closeEnough;
  initializer_list<const_pbrt::RGBColorSpace_*> *in_stack_ffffffffffffff80;
  RGBColorSpace *b_00;
  RGBColorSpace *local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  initializer_list<const_pbrt::RGBColorSpace_*> local_48;
  initializer_list<const_pbrt::RGBColorSpace_*> *local_38;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  
  local_10 = vmovlpd_avx(in_XMM0);
  local_18 = vmovlpd_avx(in_XMM1);
  local_20 = vmovlpd_avx(in_XMM2);
  local_28 = vmovlpd_avx(in_XMM3);
  local_68 = ACES2065_1;
  local_60 = DCI_P3;
  local_58 = Rec2020;
  local_50 = sRGB;
  local_48._M_array = &local_68;
  local_48._M_len = 4;
  local_38 = &local_48;
  this = (anon_class_1_0_00000001 *)
         std::initializer_list<const_pbrt::RGBColorSpace_*>::begin(local_38);
  a = (anon_class_1_0_00000001 *)
      std::initializer_list<const_pbrt::RGBColorSpace_*>::end(in_stack_ffffffffffffff80);
  while( true ) {
    if (this == a) {
      return (RGBColorSpace *)0x0;
    }
    b_00 = *(RGBColorSpace **)this;
    bVar1 = Lookup::anon_class_1_0_00000001::operator()(this,(Point2f *)a,&b_00->r);
    if ((((bVar1) &&
         (bVar1 = Lookup::anon_class_1_0_00000001::operator()(this,(Point2f *)a,&b_00->r), bVar1))
        && (bVar1 = Lookup::anon_class_1_0_00000001::operator()(this,(Point2f *)a,&b_00->r), bVar1))
       && (bVar1 = Lookup::anon_class_1_0_00000001::operator()(this,(Point2f *)a,&b_00->r), bVar1))
    break;
    this = this + 8;
  }
  return b_00;
}

Assistant:

const RGBColorSpace *RGBColorSpace::Lookup(Point2f r, Point2f g, Point2f b, Point2f w) {
    auto closeEnough = [](const Point2f &a, const Point2f &b) {
        return ((a.x == b.x || std::abs((a.x - b.x) / b.x) < 1e-3) &&
                (a.y == b.y || std::abs((a.y - b.y) / b.y) < 1e-3));
    };
    for (const RGBColorSpace *cs : {ACES2065_1, DCI_P3, Rec2020, sRGB}) {
        if (closeEnough(r, cs->r) && closeEnough(g, cs->g) && closeEnough(b, cs->b) &&
            closeEnough(w, cs->w))
            return cs;
    }
    return nullptr;
}